

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CtorExceptionTextTest.cpp
# Opt level: O2

void __thiscall WithException::WithException(WithException *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"shit happen",&local_31);
  WithException(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

WithException()
		: WithException("shit happen")
	{
	}